

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O2

void convolve_2d_sr_hor_4tap_ssse3
               (uint8_t *src,int32_t src_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_q4,int16_t *im_block)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 (*pauVar5) [16];
  uint8_t *puVar6;
  undefined2 uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m256i alVar17;
  undefined1 auVar18 [32];
  __m256i filt_256 [2];
  __m256i coeffs_256 [2];
  __m256i r [2];
  __m256i local_160;
  undefined1 local_140 [32];
  __m256i local_120;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  __m256i local_c0;
  __m256i local_a0;
  undefined1 local_80 [32];
  
  auVar16 = _DAT_004bd010;
  auVar14 = _DAT_004bd000;
  pauVar5 = (undefined1 (*) [16])(src + -1);
  if (w < 5) {
    auVar10 = vpsraw_avx(*(undefined1 (*) [16])
                          (filter_params_x->filter_ptr +
                          (uint)filter_params_x->taps * (subpel_x_q4 & 0xfU)),1);
    auVar1 = vpshufb_avx(auVar10,_DAT_004687c0);
    auVar10 = vpshufb_avx(auVar10,_DAT_004687d0);
    if (w == 2) {
      lVar4 = 0;
      auVar14._8_2_ = 2;
      auVar14._0_8_ = 0x2000200020002;
      auVar14._10_2_ = 2;
      auVar14._12_2_ = 2;
      auVar14._14_2_ = 2;
      do {
        auVar16._8_8_ = 0;
        auVar16._0_8_ = *(ulong *)*pauVar5;
        auVar16 = vmovhps_avx(auVar16,*(undefined8 *)(*pauVar5 + src_stride));
        auVar13 = vpshufb_avx(auVar16,ZEXT816(0xa09090802010100));
        auVar15 = vpshufb_avx(auVar16,ZEXT816(0xc0b0b0a04030302));
        auVar16 = vpmaddubsw_avx(auVar13,auVar1);
        auVar13 = vpmaddubsw_avx(auVar15,auVar10);
        auVar16 = vpaddw_avx(auVar16,auVar13);
        auVar16 = vpaddw_avx(auVar16,auVar14);
        auVar16 = vpsraw_avx(auVar16,2);
        *(long *)(im_block + lVar4 * 2) = auVar16._0_8_;
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride * 2);
        lVar4 = lVar4 + 2;
      } while (h != (int)lVar4);
    }
    else if (w == 4) {
      lVar4 = 0;
      auVar13._8_2_ = 2;
      auVar13._0_8_ = 0x2000200020002;
      auVar13._10_2_ = 2;
      auVar13._12_2_ = 2;
      auVar13._14_2_ = 2;
      do {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)*pauVar5;
        auVar15 = vmovhps_avx(auVar15,*(undefined8 *)(*pauVar5 + src_stride));
        auVar2 = vpshufb_avx(auVar15,auVar14);
        auVar3 = vpshufb_avx(auVar15,auVar16);
        auVar15 = vpmaddubsw_avx(auVar2,auVar1);
        auVar2 = vpmaddubsw_avx(auVar3,auVar10);
        auVar15 = vpaddw_avx(auVar15,auVar2);
        auVar15 = vpaddw_avx(auVar15,auVar13);
        auVar15 = vpsraw_avx(auVar15,2);
        *(undefined1 (*) [16])(im_block + lVar4 * 4) = auVar15;
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride * 2);
        lVar4 = lVar4 + 2;
      } while (h != (int)lVar4);
    }
  }
  else {
    auVar16 = vpsraw_avx(*(undefined1 (*) [16])
                          (filter_params_x->filter_ptr +
                          (uint)filter_params_x->taps * (subpel_x_q4 & 0xfU)),1);
    auVar14 = vpshufb_avx(auVar16,_DAT_004bcfe0);
    uVar7 = auVar14._0_2_;
    local_120[0]._2_2_ = uVar7;
    local_120[0]._0_2_ = uVar7;
    local_120[0]._4_2_ = uVar7;
    local_120[0]._6_2_ = uVar7;
    local_120[1]._0_2_ = uVar7;
    local_120[1]._2_2_ = uVar7;
    local_120[1]._4_2_ = uVar7;
    local_120[1]._6_2_ = uVar7;
    local_120[2]._0_2_ = uVar7;
    local_120[2]._2_2_ = uVar7;
    local_120[2]._4_2_ = uVar7;
    local_120[2]._6_2_ = uVar7;
    local_120[3]._0_2_ = uVar7;
    local_120[3]._2_2_ = uVar7;
    local_120[3]._4_2_ = uVar7;
    local_120[3]._6_2_ = uVar7;
    auVar14 = vpshufb_avx(auVar16,_DAT_004bcff0);
    uVar7 = auVar14._0_2_;
    local_100._2_2_ = uVar7;
    local_100._0_2_ = uVar7;
    local_100._4_2_ = uVar7;
    local_100._6_2_ = uVar7;
    local_100._8_2_ = uVar7;
    local_100._10_2_ = uVar7;
    local_100._12_2_ = uVar7;
    local_100._14_2_ = uVar7;
    local_100._16_2_ = uVar7;
    local_100._18_2_ = uVar7;
    local_100._20_2_ = uVar7;
    local_100._22_2_ = uVar7;
    local_100._24_2_ = uVar7;
    local_100._26_2_ = uVar7;
    local_100._28_2_ = uVar7;
    local_100._30_2_ = uVar7;
    alVar17._16_16_ = _DAT_00468c20;
    alVar17._0_16_ = _DAT_00468c20;
    auVar18._16_16_ = _DAT_00468800;
    auVar18._0_16_ = _DAT_00468800;
    local_160 = alVar17;
    local_140 = auVar18;
    switch(w << 0x1d | w - 8U >> 3) {
    case 0:
      auVar8._8_2_ = 2;
      auVar8._0_8_ = 0x2000200020002;
      auVar8._10_2_ = 2;
      auVar8._12_2_ = 2;
      auVar8._14_2_ = 2;
      auVar8._16_2_ = 2;
      auVar8._18_2_ = 2;
      auVar8._20_2_ = 2;
      auVar8._22_2_ = 2;
      auVar8._24_2_ = 2;
      auVar8._26_2_ = 2;
      auVar8._28_2_ = 2;
      auVar8._30_2_ = 2;
      do {
        auVar11._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar5 + src_stride) + ZEXT116(1) * *pauVar5;
        auVar11._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar5 + src_stride);
        auVar12 = vpshufb_avx2(auVar11,(undefined1  [32])alVar17);
        auVar9 = vpshufb_avx2(auVar11,auVar18);
        auVar12 = vpmaddubsw_avx2(auVar12,(undefined1  [32])local_120);
        auVar9 = vpmaddubsw_avx2(auVar9,local_100);
        auVar12 = vpaddw_avx2(auVar12,auVar9);
        auVar12 = vpaddw_avx2(auVar12,auVar8);
        auVar12 = vpsraw_avx2(auVar12,2);
        *(undefined1 (*) [32])im_block = auVar12;
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride * 2);
        im_block = (int16_t *)((long)im_block + 0x20);
        h = h + -2;
      } while (h != 0);
      break;
    case 1:
      pauVar5 = (undefined1 (*) [16])(src + 7);
      local_e0 = local_100;
      local_c0 = local_120;
      do {
        auVar12._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(pauVar5[-1] + (long)src_stride + 8) +
             ZEXT116(1) * *(undefined1 (*) [16])(pauVar5[-1] + 8);
        auVar12._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(pauVar5[-1] + (long)src_stride + 8);
        auVar8 = vpshufb_avx2(auVar12,(undefined1  [32])alVar17);
        auVar12 = vpshufb_avx2(auVar12,auVar18);
        auVar8 = vpmaddubsw_avx2(auVar8,(undefined1  [32])local_c0);
        auVar12 = vpmaddubsw_avx2(auVar12,local_e0);
        local_a0 = (__m256i)vpaddw_avx2(auVar12,auVar8);
        auVar9._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar5 + src_stride) + ZEXT116(1) * *pauVar5;
        auVar9._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar5 + src_stride);
        auVar8 = vpshufb_avx2(auVar9,(undefined1  [32])alVar17);
        auVar12 = vpshufb_avx2(auVar9,auVar18);
        auVar18 = vpmaddubsw_avx2(auVar8,(undefined1  [32])local_c0);
        auVar8 = vpmaddubsw_avx2(auVar12,local_e0);
        local_80 = vpaddw_avx2(auVar8,auVar18);
        xy_x_round_store_32_avx2(&local_a0,im_block);
        auVar18._16_16_ = _DAT_00468800;
        auVar18._0_16_ = _DAT_00468800;
        alVar17[2] = _DAT_00468c20;
        alVar17[3] = _UNK_00468c28;
        alVar17[0] = _DAT_00468c20;
        alVar17[1] = _UNK_00468c28;
        im_block = im_block + 0x20;
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride * 2);
        h = h + -2;
      } while (h != 0);
      break;
    default:
      puVar6 = src + 0x5f;
      do {
        xy_x_4tap_32_avx2(puVar6 + -0x60,&local_120,&local_160,im_block);
        xy_x_4tap_32_avx2(puVar6 + -0x40,&local_120,&local_160,im_block + 0x20);
        xy_x_4tap_32_avx2(puVar6 + -0x20,&local_120,&local_160,im_block + 0x40);
        xy_x_4tap_32_avx2(puVar6,&local_120,&local_160,im_block + 0x60);
        puVar6 = puVar6 + src_stride;
        im_block = im_block + 0x80;
        h = h + -1;
      } while (h != 0);
      break;
    case 3:
      do {
        xy_x_4tap_32_avx2((uint8_t *)pauVar5,&local_120,&local_160,im_block);
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride);
        im_block = im_block + 0x20;
        h = h + -1;
      } while (h != 0);
      break;
    case 7:
      puVar6 = src + 0x1f;
      do {
        xy_x_4tap_32_avx2(puVar6 + -0x20,&local_120,&local_160,im_block);
        xy_x_4tap_32_avx2(puVar6,&local_120,&local_160,im_block + 0x20);
        puVar6 = puVar6 + src_stride;
        im_block = im_block + 0x40;
        h = h + -1;
      } while (h != 0);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_hor_4tap_ssse3(
    const uint8_t *const src, const int32_t src_stride, const int32_t w,
    const int32_t h, const InterpFilterParams *const filter_params_x,
    const int32_t subpel_x_q4, int16_t *const im_block) {
  const uint8_t *src_ptr = src - 1;
  int32_t y = h;
  int16_t *im = im_block;

  if (w <= 4) {
    __m128i coeffs_128[2];

    prepare_half_coeffs_4tap_ssse3(filter_params_x, subpel_x_q4, coeffs_128);
    if (w == 2) {
      do {
        const __m128i r =
            x_convolve_4tap_2x2_ssse3(src_ptr, src_stride, coeffs_128);
        xy_x_round_store_2x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 2;
        y -= 2;
      } while (y);
    } else if (w == 4) {
      do {
        const __m128i r =
            x_convolve_4tap_4x2_ssse3(src_ptr, src_stride, coeffs_128);
        xy_x_round_store_4x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 4;
        y -= 2;
      } while (y);
    }
  } else {
    // TODO(chiyotsai@google.com): Add better optimization
    __m256i coeffs_256[2], filt_256[2];

    prepare_half_coeffs_4tap_avx2(filter_params_x, subpel_x_q4, coeffs_256);
    filt_256[0] = _mm256_load_si256((__m256i const *)filt1_global_avx2);
    filt_256[1] = _mm256_load_si256((__m256i const *)filt2_global_avx2);

    if (w == 8) {
      do {
        __m256i res =
            x_convolve_4tap_8x2_avx2(src_ptr, src_stride, coeffs_256, filt_256);
        xy_x_round_store_8x2_avx2(res, im);

        src_ptr += 2 * src_stride;
        im += 2 * 8;
        y -= 2;
      } while (y);
    } else if (w == 16) {
      do {
        __m256i r[2];

        x_convolve_4tap_16x2_avx2(src_ptr, src_stride, coeffs_256, filt_256, r);
        xy_x_round_store_32_avx2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 16;
        y -= 2;
      } while (y);
    } else if (w == 32) {
      do {
        xy_x_4tap_32_avx2(src_ptr, coeffs_256, filt_256, im);

        src_ptr += src_stride;
        im += 32;
      } while (--y);
    } else if (w == 64) {
      do {
        xy_x_4tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        xy_x_4tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
        src_ptr += src_stride;
        im += 64;
      } while (--y);
    } else {
      assert(w == 128);

      do {
        xy_x_4tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        xy_x_4tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
        xy_x_4tap_32_avx2(src_ptr + 64, coeffs_256, filt_256, im + 64);
        xy_x_4tap_32_avx2(src_ptr + 96, coeffs_256, filt_256, im + 96);
        src_ptr += src_stride;
        im += 128;
      } while (--y);
    }
  }
}